

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preEnd__modifier
          (ColladaParserAutoGen15Private *this)

{
  ParserChar **text;
  ColladaParserAutoGen15 *pCVar1;
  bool bVar2;
  int iVar3;
  StringHash SVar4;
  long lVar5;
  undefined1 uVar6;
  bool failed;
  bool local_19;
  
  text = &(this->
          super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
          ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData;
  SVar4 = GeneratedSaxParser::Utils::calculateStringHash
                    (text,(this->
                          super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                          ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack,&local_19);
  lVar5 = 8;
  do {
    if (*(StringHash *)((long)&DAT_00836978 + lVar5) == SVar4) {
      local_19 = false;
      pCVar1 = (this->
               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
               ).mImpl;
      iVar3 = (*pCVar1->_vptr_ColladaParserAutoGen15[0x16d])
                        (pCVar1,(ulong)*(uint *)((long)&ENUM__fx_modifier_enumMap + lVar5));
      uVar6 = (undefined1)iVar3;
      goto LAB_0070c3b4;
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x78);
  local_19 = true;
  bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                    ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                     ERROR_TEXTDATA_PARSING_FAILED,0x5afc882,(ParserChar *)0x0,
                     (this->
                     super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                     ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData);
  uVar6 = !bVar2;
LAB_0070c3b4:
  if (*text != (ParserChar *)0x0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              (&(this->
                super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ).super_ParserTemplateBase.mStackMemoryManager);
  }
  *text = (ParserChar *)0x0;
  (this->
  super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
  ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack = (ParserChar *)0x0;
  return (bool)uVar6;
}

Assistant:

bool ColladaParserAutoGen15Private::_preEnd__modifier()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__modifier();
        if ( !validationResult ) return false;

    } // validation
#endif

bool failed;
ENUM__fx_modifier_enum parameter = Utils::toEnum<ENUM__fx_modifier_enum, StringHash, ENUM__fx_modifier_enum__COUNT>((const ParserChar**)&mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack, failed, ENUM__fx_modifier_enumMap, Utils::calculateStringHash);
bool returnValue;
if (!failed)
{
    returnValue = mImpl->data__modifier(parameter);
}
else
    returnValue = !handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_TEXTDATA_PARSING_FAILED, HASH_ELEMENT_MODIFIER, (const ParserChar*)0, mLastIncompleteFragmentInCharacterData);
if (mLastIncompleteFragmentInCharacterData)
    mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;

}